

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int SplitString(char *str,char **tokens,int maxTokens)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (maxTokens < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    do {
      pcVar1 = strtok(str," \t\n");
      tokens[uVar2] = pcVar1;
      uVar3 = uVar2;
      if (pcVar1 == (char *)0x0) break;
      uVar2 = uVar2 + 1;
      str = (char *)0x0;
      uVar3 = (ulong)(uint)maxTokens;
    } while ((uint)maxTokens != uVar2);
  }
  return (int)uVar3;
}

Assistant:

int SplitString(char* str, char* tokens[], const int maxTokens)
{
    int i = 0;
    for(i = 0; i < maxTokens; i++)
    {
        char* token = strtok(str, " \t\n");
        str = NULL;
        tokens[i] = token;
        if(token == NULL)
        {
            break;
        }
    }
    return i;
}